

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LWSLoader.h
# Opt level: O2

void __thiscall Assimp::LWS::Element::~Element(Element *this)

{
  long lVar1;
  
  std::__cxx11::_List_base<Assimp::LWS::Element,_std::allocator<Assimp::LWS::Element>_>::_M_clear
            (&(this->children).
              super__List_base<Assimp::LWS::Element,_std::allocator<Assimp::LWS::Element>_>);
  lVar1 = 0x20;
  do {
    std::__cxx11::string::~string((string *)((long)&this->tokens[0]._M_dataplus._M_p + lVar1));
    lVar1 = lVar1 + -0x20;
  } while (lVar1 != -0x20);
  return;
}

Assistant:

Element()
    {}